

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::readyReadSlot(QHttpThreadDelegate *this)

{
  size_t __nbytes;
  bool bVar1;
  qint64 qVar2;
  void *__buf;
  long in_FS_OFFSET;
  QArrayData *local_60 [3];
  void *local_48;
  QHttpNetworkReply *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(this + 0x150) != 0) && (*(long *)(this + 0x120) == 0)) {
    if (*(long *)(this + 0x38) == 0) {
      bVar1 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150));
      if (bVar1) {
        do {
          LOCK();
          **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
          UNLOCK();
          QHttpNetworkReply::readAny((QByteArray *)local_60,*(QHttpNetworkReply **)(this + 0x150));
          local_48 = (void *)0x0;
          pQStack_40 = (QHttpNetworkReply *)local_60;
          QMetaObject::activate((QObject *)this,&staticMetaObject,10,&local_48);
          if (local_60[0] != (QArrayData *)0x0) {
            LOCK();
            (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60[0],1,0x10);
            }
          }
          bVar1 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150));
        } while (bVar1);
      }
    }
    else if ((*(long *)(this + 0x40) < *(long *)(this + 0x38)) &&
            (bVar1 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150)),
            bVar1)) {
      __buf = (void *)0x0;
      do {
        if (*(long *)(this + 0x38) - *(long *)(this + 0x40) <= (long)__buf) break;
        qVar2 = QHttpNetworkReply::sizeNextBlock(*(QHttpNetworkReply **)(this + 0x150));
        __nbytes = *(size_t *)(this + 0x38);
        __buf = (void *)(__nbytes - *(long *)(this + 0x40));
        if ((long)__buf < qVar2) {
          *(size_t *)(this + 0x40) = __nbytes;
          LOCK();
          **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
          UNLOCK();
          QHttpNetworkReply::read
                    ((QHttpNetworkReply *)local_60,(int)*(undefined8 *)(this + 0x150),__buf,__nbytes
                    );
        }
        else {
          __buf = (void *)QHttpNetworkReply::sizeNextBlock(*(QHttpNetworkReply **)(this + 0x150));
          *(long *)(this + 0x40) = *(long *)(this + 0x40) + (long)__buf;
          LOCK();
          **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
          UNLOCK();
          QHttpNetworkReply::readAny((QByteArray *)local_60,*(QHttpNetworkReply **)(this + 0x150));
        }
        local_48 = (void *)0x0;
        pQStack_40 = (QHttpNetworkReply *)local_60;
        QMetaObject::activate((QObject *)this,&staticMetaObject,10,&local_48);
        if (local_60[0] != (QArrayData *)0x0) {
          LOCK();
          (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60[0],1,0x10);
          }
        }
        bVar1 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150));
      } while (bVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::readyReadSlot()
{
    if (!httpReply)
        return;

    // Don't do in zerocopy case
    if (!downloadBuffer.isNull())
        return;

    if (readBufferMaxSize) {
        if (bytesEmitted < readBufferMaxSize) {
            qint64 sizeEmitted = 0;
            while (httpReply->readAnyAvailable() && (sizeEmitted < (readBufferMaxSize-bytesEmitted))) {
                if (httpReply->sizeNextBlock() > (readBufferMaxSize-bytesEmitted)) {
                    sizeEmitted = readBufferMaxSize-bytesEmitted;
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->read(sizeEmitted));
                } else {
                    sizeEmitted = httpReply->sizeNextBlock();
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->readAny());
                }
            }
        } else {
            // We need to wait until we empty data from the read buffer in the reply.
        }

    } else {
        while (httpReply->readAnyAvailable()) {
            pendingDownloadData->fetchAndAddRelease(1);
            emit downloadData(httpReply->readAny());
        }
    }
}